

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

void __thiscall ExprTree::~ExprTree(ExprTree *this)

{
  pointer ppOVar1;
  OpTpl *this_00;
  _Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_> *this_01;
  int4 i;
  ulong uVar2;
  
  if (this->outvn != (VarnodeTpl *)0x0) {
    operator_delete(this->outvn);
  }
  this_01 = &this->ops->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>;
  if (this_01 != (_Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0) {
    for (uVar2 = 0; ppOVar1 = (this_01->_M_impl).super__Vector_impl_data._M_start,
        uVar2 < (ulong)((long)(this_01->_M_impl).super__Vector_impl_data._M_finish - (long)ppOVar1
                       >> 3); uVar2 = uVar2 + 1) {
      this_00 = ppOVar1[uVar2];
      if (this_00 != (OpTpl *)0x0) {
        OpTpl::~OpTpl(this_00);
      }
      operator_delete(this_00);
      this_01 = &this->ops->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>;
    }
    std::_Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>::~_Vector_base(this_01);
    operator_delete(this_01);
    return;
  }
  return;
}

Assistant:

ExprTree::~ExprTree(void)

{
  if (outvn != (VarnodeTpl *)0)
    delete outvn;
  if (ops != (vector<OpTpl *> *)0) {
    for(int4 i=0;i<ops->size();++i)
      delete (*ops)[i];
    delete ops;
  }
}